

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.h
# Opt level: O1

void __thiscall Client::requestAccessToken(Client *this)

{
  size_type *psVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined1 *puVar4;
  double dVar5;
  undefined8 uVar6;
  logger *this_00;
  long *plVar7;
  undefined8 *puVar8;
  const_reference pvVar9;
  long lVar10;
  Response *pRVar11;
  long *plVar12;
  ulong *puVar13;
  Error extraout_EDX;
  Error extraout_EDX_00;
  Error extraout_EDX_01;
  Error error;
  long lVar14;
  undefined8 uVar15;
  ulong uVar16;
  Json resultJson;
  unsigned_long ret;
  Result result;
  string __str;
  string data;
  string local_1c8;
  string local_1a8;
  undefined1 local_188 [24];
  undefined3 uStack_170;
  undefined5 uStack_16d;
  _Base_ptr local_168;
  size_t sStack_160;
  undefined1 local_158 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_148;
  ulong *local_118;
  long local_110;
  ulong local_108 [2];
  string local_f8;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  this_00 = spdlog::default_logger_raw();
  local_158._0_8_ = (__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)0x0
  ;
  local_158._8_8_ = 0;
  local_148._M_impl._0_8_ = 0;
  dVar5 = spdlog::logger::log(this_00,0.0);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>(SUB84(dVar5,0),&local_f8,"grant_type=password","")
  ;
  pcVar2 = local_188 + 0x10;
  local_188._16_8_ = (_Base_ptr)0x6d616e7265737526;
  local_188._8_8_ = 10;
  uStack_170 = 0x3d65;
  local_188._0_8_ = pcVar2;
  plVar7 = (long *)std::__cxx11::string::append(local_188);
  puVar4 = local_158 + 0x10;
  pRVar11 = (Response *)(plVar7 + 2);
  if ((Response *)*plVar7 == pRVar11) {
    local_148._M_impl._0_8_ = (pRVar11->version)._M_dataplus._M_p;
    local_148._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar7[3];
    local_158._0_8_ = puVar4;
  }
  else {
    local_148._M_impl._0_8_ = (pRVar11->version)._M_dataplus._M_p;
    local_158._0_8_ = (Response *)*plVar7;
  }
  local_158._8_8_ = plVar7[1];
  *plVar7 = (long)pRVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_f8,local_158._0_8_);
  if ((undefined1 *)local_158._0_8_ != puVar4) {
    operator_delete((void *)local_158._0_8_,(ulong)(local_148._M_impl._0_8_ + 1));
  }
  if ((pointer)local_188._0_8_ != pcVar2) {
    operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
  }
  local_188._16_8_ = (_Base_ptr)0x726f777373617026;
  local_188._8_8_ = 10;
  uStack_170 = 0x3d64;
  local_188._0_8_ = pcVar2;
  plVar7 = (long *)std::__cxx11::string::append(local_188);
  pRVar11 = (Response *)(plVar7 + 2);
  if ((Response *)*plVar7 == pRVar11) {
    local_148._M_impl._0_8_ = (pRVar11->version)._M_dataplus._M_p;
    local_148._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar7[3];
    local_158._0_8_ = puVar4;
  }
  else {
    local_148._M_impl._0_8_ = (pRVar11->version)._M_dataplus._M_p;
    local_158._0_8_ = (Response *)*plVar7;
  }
  local_158._8_8_ = plVar7[1];
  *plVar7 = (long)pRVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_f8,local_158._0_8_);
  if ((undefined1 *)local_158._0_8_ != puVar4) {
    operator_delete((void *)local_158._0_8_,(ulong)(local_148._M_impl._0_8_ + 1));
  }
  if ((pointer)local_188._0_8_ != pcVar2) {
    operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
  }
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"/api/v1/access_token","");
  paVar3 = &local_1a8.field_2;
  local_1a8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,"application/x-www-form-urlencoded","");
  _uStack_170 = local_188 + 8;
  local_188._16_8_ = (_Base_ptr)0x0;
  local_188._0_8_ = (pointer)0x0;
  local_188._8_8_ = 0;
  sStack_160 = 0;
  local_168 = (_Base_ptr)_uStack_170;
  httplib::ClientImpl::Post
            ((Result *)local_158,
             (this->tokenClient).cli_._M_t.
             super___uniq_ptr_impl<httplib::ClientImpl,_std::default_delete<httplib::ClientImpl>_>.
             _M_t.
             super__Tuple_impl<0UL,_httplib::ClientImpl_*,_std::default_delete<httplib::ClientImpl>_>
             .super__Head_base<0UL,_httplib::ClientImpl_*,_false>._M_head_impl,&local_1c8,
             (Headers *)local_188,&local_f8,&local_1a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_188);
  error = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    error = extraout_EDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    error = extraout_EDX_01;
  }
  uVar6 = local_158._0_8_;
  httplib::to_string_abi_cxx11_((string *)local_188,(httplib *)(local_158._8_8_ & 0xffffffff),error)
  ;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"File: ","");
  plVar7 = (long *)std::__cxx11::string::append((char *)local_78);
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_a8 = *plVar12;
    lStack_a0 = plVar7[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar12;
    local_b8 = (long *)*plVar7;
  }
  local_b0 = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_b8);
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_88 = *plVar12;
    lStack_80 = plVar7[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar12;
    local_98 = (long *)*plVar7;
  }
  local_90 = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
  local_d8 = &local_c8;
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_c8 = *plVar12;
    lStack_c0 = plVar7[3];
  }
  else {
    local_c8 = *plVar12;
    local_d8 = (long *)*plVar7;
  }
  local_d0 = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_d8);
  puVar13 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_1a8.field_2._M_allocated_capacity = *puVar13;
    local_1a8.field_2._8_8_ = plVar7[3];
    local_1a8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_1a8.field_2._M_allocated_capacity = *puVar13;
    local_1a8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1a8._M_string_length = plVar7[1];
  *plVar7 = (long)puVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_118 = local_108;
  std::__cxx11::string::_M_construct((ulong)&local_118,'\x02');
  *(undefined2 *)local_118 = 0x3339;
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar3) {
    uVar15 = local_1a8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_110 + local_1a8._M_string_length) {
    uVar16 = 0xf;
    if (local_118 != local_108) {
      uVar16 = local_108[0];
    }
    if (local_110 + local_1a8._M_string_length <= uVar16) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_118,0,(char *)0x0,(ulong)local_1a8._M_dataplus._M_p);
      goto LAB_001170a0;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_118);
LAB_001170a0:
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  psVar1 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_1c8.field_2._M_allocated_capacity = *psVar1;
    local_1c8.field_2._8_8_ = puVar8[3];
  }
  else {
    local_1c8.field_2._M_allocated_capacity = *psVar1;
    local_1c8._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_1c8._M_string_length = puVar8[1];
  *puVar8 = psVar1;
  puVar8[1] = 0;
  *(undefined1 *)psVar1 = 0;
  check<char_const(&)[14],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
            ((Response *)uVar6 != (Response *)0x0,(char (*) [14])"Error state: ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
             (char (*) [2])0x174ca1,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_118 != local_108) {
    operator_delete(local_118,local_108[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
    operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
  }
  check<std::__cxx11::string_const&>
            (*(int *)(local_158._0_8_ + 0x20) == 200,(string *)(local_158._0_8_ + 0x28));
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (code *)0x0;
  uStack_40 = 0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<std::__cxx11::string_const&>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_1c8,(string *)(local_158._0_8_ + 0x78),(parser_callback_t *)&local_58,true,
             false);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  pvVar9 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)&local_1c8,"access_token");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (local_188,pvVar9);
  std::__cxx11::string::operator=((string *)&this->accessToken,(string *)local_188);
  if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
    operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
  }
  pvVar9 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)&local_1c8,"expires_in");
  local_188._0_8_ = (pointer)0x0;
  nlohmann::json_abi_v3_11_2::detail::
  get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
            (pvVar9,(unsigned_long *)local_188);
  lVar14 = local_188._0_8_ * 1000000000;
  lVar10 = std::chrono::_V2::system_clock::now();
  (this->accessTokenExpiration).__d.__r = lVar10 + -10000000000 + lVar14;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&local_1c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_158 + 0x10));
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
            ((unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> *)local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void requestAccessToken() {
        spdlog::info("Requesting new access token");

        std::string data = "grant_type=password";
        data += "&username="s + bot_name;
        data += "&password="s + bot_password;

        const httplib::Result result = tokenClient.Post("/api/v1/access_token", data, "application/x-www-form-urlencoded");
        check(result, "Error state: ", httplib::to_string(result.error()), "\n", STD_HERE);
        check(result->status == 200, result->reason);

        const Json resultJson = Json::parse(result->body);

        accessToken = resultJson["access_token"].get<std::string>();
        accessTokenExpiration = std::chrono::seconds(resultJson["expires_in"].get<size_t>()) + Clock::now() - std::chrono::seconds(10);
    }